

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging_p.h
# Opt level: O0

void __thiscall
QInternalMessageLogContext::QInternalMessageLogContext
          (QInternalMessageLogContext *this,QMessageLogContext *logContext,
          QLoggingCategory *categoryOverride)

{
  int iVar1;
  char *pcVar2;
  QLoggingCategory *in_RDX;
  QInternalMessageLogContext *in_RDI;
  int backtraceFrames;
  QMessageLogContext *in_stack_ffffffffffffff90;
  QInternalMessageLogContext *this_00;
  QInternalMessageLogContext *this_01;
  
  this_00 = in_RDI;
  QMessageLogContext::QMessageLogContext(&in_RDI->super_QMessageLogContext);
  this_01 = (QInternalMessageLogContext *)&in_RDI->backtrace;
  std::optional<QVarLengthArray<void_*,_32LL>_>::optional
            ((optional<QVarLengthArray<void_*,_32LL>_> *)0x249fc2);
  iVar1 = initFrom(this_00,in_stack_ffffffffffffff90);
  if (iVar1 != 0) {
    populateBacktrace(this_01,(int)((ulong)this_00 >> 0x20));
  }
  pcVar2 = QLoggingCategory::categoryName(in_RDX);
  (this_00->super_QMessageLogContext).category = pcVar2;
  return;
}

Assistant:

QInternalMessageLogContext(const QMessageLogContext &logContext,
                               const QLoggingCategory &categoryOverride)
        : QInternalMessageLogContext(logContext)
    {
        category = categoryOverride.categoryName();
    }